

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathNodeSetAddNs(xmlNodeSetPtr cur,xmlNodePtr node,xmlNsPtr ns)

{
  int iVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = -1;
  if ((((node != (xmlNodePtr)0x0) && (cur != (xmlNodeSetPtr)0x0)) && (ns != (xmlNsPtr)0x0)) &&
     ((ns->type == XML_NAMESPACE_DECL && (node->type == XML_ELEMENT_NODE)))) {
    for (lVar4 = 0; lVar4 < cur->nodeNr; lVar4 = lVar4 + 1) {
      pxVar2 = cur->nodeTab[lVar4];
      if (((pxVar2 != (xmlNodePtr)0x0) && (pxVar2->type == XML_NAMESPACE_DECL)) &&
         (((xmlNodePtr)pxVar2->_private == node &&
          (iVar1 = xmlStrEqual(ns->prefix,(xmlChar *)pxVar2->children), iVar1 != 0))))
      goto LAB_001af70d;
    }
    if ((cur->nodeMax <= cur->nodeNr) && (iVar1 = xmlXPathNodeSetGrow(cur), iVar1 < 0)) {
      return -1;
    }
    pxVar2 = xmlXPathNodeSetDupNs(node,ns);
    if (pxVar2 != (xmlNodePtr)0x0) {
      iVar3 = cur->nodeNr;
      cur->nodeNr = iVar3 + 1;
      cur->nodeTab[iVar3] = pxVar2;
LAB_001af70d:
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
xmlXPathNodeSetAddNs(xmlNodeSetPtr cur, xmlNodePtr node, xmlNsPtr ns) {
    int i;
    xmlNodePtr nsNode;

    if ((cur == NULL) || (ns == NULL) || (node == NULL) ||
        (ns->type != XML_NAMESPACE_DECL) ||
	(node->type != XML_ELEMENT_NODE))
	return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++) {
        if ((cur->nodeTab[i] != NULL) &&
	    (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) &&
	    (((xmlNsPtr)cur->nodeTab[i])->next == (xmlNsPtr) node) &&
	    (xmlStrEqual(ns->prefix, ((xmlNsPtr)cur->nodeTab[i])->prefix)))
	    return(0);
    }

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeNr >= cur->nodeMax) {
        if (xmlXPathNodeSetGrow(cur) < 0)
            return(-1);
    }
    nsNode = xmlXPathNodeSetDupNs(node, ns);
    if(nsNode == NULL)
        return(-1);
    cur->nodeTab[cur->nodeNr++] = nsNode;
    return(0);
}